

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtTxInIndex(void *handle,void *psbt_handle,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  allocator local_91;
  OutPoint outpoint;
  Txid local_68;
  string local_48;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&outpoint,"PsbtHandle",(allocator *)&local_68);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&outpoint);
  std::__cxx11::string::~string((string *)&outpoint);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    outpoint.txid_._vptr_Txid = (_func_int **)0x4fd756;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5d4;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
    cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&outpoint,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_68);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&outpoint);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (index != (uint32_t *)0x0) {
    if (*(long *)((long)psbt_handle + 0x18) != 0) {
      std::__cxx11::string::string((string *)&local_48,txid,&local_91);
      cfd::core::Txid::Txid(&local_68,&local_48);
      cfd::core::OutPoint::OutPoint(&outpoint,&local_68,vout);
      cfd::core::Txid::~Txid(&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      uVar2 = cfd::Psbt::GetTxInIndex(*(Psbt **)((long)psbt_handle + 0x18),&outpoint);
      *index = uVar2;
      cfd::core::Txid::~Txid(&outpoint.txid_);
      return 0;
    }
    outpoint.txid_._vptr_Txid = (_func_int **)0x4fd756;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5e0;
    outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
    cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"psbt is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&outpoint,"Failed to handle statement. psbt is null.",
               (allocator *)&local_68);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&outpoint);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  outpoint.txid_._vptr_Txid = (_func_int **)0x4fd756;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5da;
  outpoint.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "CfdGetPsbtTxInIndex";
  cfd::core::logger::warn<>((CfdSourceLocation *)&outpoint,"index is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&outpoint,"Failed to parameter. index is null.",(allocator *)&local_68);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&outpoint);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtTxInIndex(
    void* handle, void* psbt_handle, const char* txid, uint32_t vout,
    uint32_t* index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (index == nullptr) {
      warn(CFD_LOG_SOURCE, "index is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. index is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }
    OutPoint outpoint(Txid(txid), vout);

    *index = psbt_obj->psbt->GetTxInIndex(outpoint);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}